

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBarLayout::setIconSize(ToolBarLayout *this,QSize *s)

{
  QObject *object;
  ToolButton *this_00;
  QForeachContainer<QList<QLayoutItem_*>_> _container_315;
  QForeachContainer<QList<QLayoutItem_*>_> QStack_48;
  
  QtPrivate::QForeachContainer<QList<QLayoutItem_*>_>::QForeachContainer(&QStack_48,&this->buttons);
  for (; QStack_48.i.i != QStack_48.e.i; QStack_48.i.i = QStack_48.i.i + 1) {
    object = (QObject *)(**(code **)(*(long *)*QStack_48.i.i + 0x68))();
    this_00 = qobject_cast<QtMWidgets::ToolButton*>(object);
    if (this_00 != (ToolButton *)0x0) {
      ToolButton::setIconSize(this_00,s);
    }
  }
  QArrayDataPointer<QLayoutItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QLayoutItem_*> *)&QStack_48);
  QLayout::update();
  return;
}

Assistant:

void
ToolBarLayout::setIconSize( const QSize & s )
{
	foreach( QLayoutItem * item, buttons )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( item->widget() );

		if( b )
			b->setIconSize( s );
	}

	update();
}